

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  char *pcVar1;
  byte *pbVar2;
  sqlite3_index_constraint *psVar3;
  sqlite3_index_orderby *psVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  WhereInfo *pWVar10;
  Parse *pParse;
  SrcList *pSVar11;
  WhereLoop *p;
  ExprList *pEVar12;
  Table *pTVar13;
  Expr *pEVar14;
  Column *pCVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  char *pcVar19;
  sqlite3_index_info *pIdxInfo;
  int iVar20;
  Bitmask *pBVar21;
  char *pcVar22;
  long lVar23;
  Expr *pEVar24;
  long lVar25;
  u8 uVar26;
  anon_union_8_3_bb5b150a_for_u *paVar27;
  int iVar28;
  ulong uVar29;
  int iVar30;
  ushort uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  u16 mNoOmit;
  uint uVar37;
  ulong uVar38;
  bool bVar39;
  ulong local_b0;
  int bRetry;
  int bIn;
  code *local_60;
  code *local_58;
  u16 local_44;
  WhereClause *local_38;
  
  bRetry = 0;
  pWVar10 = pBuilder->pWInfo;
  local_38 = pBuilder->pWC;
  pParse = pWVar10->pParse;
  pSVar11 = pWVar10->pTabList;
  p = pBuilder->pNew;
  bVar5 = p->iTab;
  pEVar12 = pWVar10->pOrderBy;
  pTVar13 = pSVar11->a[bVar5].pTab;
  iVar17 = local_38->nTerm;
  uVar18 = 0;
  if (iVar17 < 1) {
    local_b0 = 0;
  }
  else {
    iVar9 = pSVar11->a[bVar5].iCursor;
    pBVar21 = &local_38->a->prereqRight;
    iVar28 = 0;
    do {
      uVar7 = *(u16 *)((long)pBVar21 + -0x16);
      *(ushort *)((long)pBVar21 + -0x16) = uVar7 & 0xffbf;
      if (((*(int *)((long)pBVar21 + -0xc) == iVar9) && ((*pBVar21 & mUnusable) == 0)) &&
         (-1 < (char)uVar7 && (*pBVar21 & 0xf7ff00000000) != 0)) {
        bVar6 = pSVar11->a[bVar5].fg.jointype;
        if ((bVar6 & 0x58) != 0) {
          uVar37 = ((WhereTerm *)(pBVar21 + -5))->pExpr->flags;
          if ((((uVar37 & 3) == 0) || ((((WhereTerm *)(pBVar21 + -5))->pExpr->w).iJoin != iVar9)) ||
             (((bVar6 & 0x18) != 0 && ((uVar37 & 2) != 0)))) goto LAB_0018c4fc;
        }
        iVar28 = iVar28 + 1;
        *(ushort *)((long)pBVar21 + -0x16) = uVar7 | 0x40;
      }
LAB_0018c4fc:
      pBVar21 = pBVar21 + 7;
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
    local_b0 = (ulong)iVar28;
  }
  iVar17 = 0;
  if (pEVar12 != (ExprList *)0x0) {
    iVar9 = pEVar12->nExpr;
    uVar18 = 0;
    lVar23 = 0;
    if ((long)iVar9 < 1) {
LAB_0018c6ab:
      iVar17 = 0;
      if ((int)lVar23 != iVar9) goto LAB_0018c6e6;
    }
    else {
      lVar23 = 0;
      do {
        pEVar24 = pEVar12->a[lVar23].pExpr;
        local_44 = 1;
        _bIn = (Parse *)0x0;
        local_60 = exprNodeIsConstant;
        local_58 = sqlite3SelectWalkFail;
        if ((pEVar24 != (Expr *)0x0) && (sqlite3WalkExprNN((Walker *)&bIn,pEVar24), local_44 == 0))
        {
          if ((pEVar12->a[lVar23].fg.sortFlags & 2) != 0) goto LAB_0018c6ab;
          if (pEVar24->op == 'q') {
            pEVar14 = pEVar24->pLeft;
            if ((pEVar14->op != 0xa7) || (pEVar14->iTable != pSVar11->a[bVar5].iCursor))
            goto LAB_0018c6ab;
            lVar25 = (long)pEVar14->iColumn;
            pEVar24->iColumn = pEVar14->iColumn;
            if (-1 < lVar25) {
              pCVar15 = pTVar13->aCol;
              uVar7 = pCVar15[lVar25].colFlags;
              if ((uVar7 >> 9 & 1) == 0) {
                pcVar19 = (char *)0x0;
              }
              else {
                pcVar19 = pCVar15[lVar25].zCnName + -1;
                do {
                  pcVar22 = pcVar19 + 1;
                  pcVar19 = pcVar19 + 1;
                } while (*pcVar22 != '\0');
                pcVar22 = pcVar19;
                if ((uVar7 & 4) != 0) {
                  do {
                    pcVar19 = pcVar22 + 1;
                    pcVar1 = pcVar22 + 1;
                    pcVar22 = pcVar19;
                  } while (*pcVar1 != '\0');
                }
                pcVar19 = pcVar19 + 1;
              }
              if ((pEVar24->u).zToken != (char *)0x0) {
                if (pcVar19 == (char *)0x0) {
                  pcVar19 = "BINARY";
                }
                lVar25 = 0;
                do {
                  bVar6 = (pEVar24->u).zToken[lVar25];
                  if (bVar6 == pcVar19[lVar25]) {
                    if ((ulong)bVar6 == 0) goto LAB_0018c69d;
                  }
                  else if (""[bVar6] != ""[(byte)pcVar19[lVar25]]) break;
                  lVar25 = lVar25 + 1;
                } while( true );
              }
              goto LAB_0018c6ab;
            }
          }
          else if ((pEVar24->op != 0xa7) || (pEVar24->iTable != pSVar11->a[bVar5].iCursor))
          goto LAB_0018c6ab;
        }
LAB_0018c69d:
        lVar23 = lVar23 + 1;
      } while (lVar23 != iVar9);
    }
    uVar7 = pWVar10->wctrlFlags;
    iVar17 = iVar9;
    if (((char)uVar7 < '\0') && ((pSVar11->a[bVar5].fg.field_0x2 & 0x40) == 0)) {
      uVar18 = uVar7 >> 9 & 1 | 2;
    }
    else {
      uVar18 = uVar7 >> 6 & 1;
    }
  }
LAB_0018c6e6:
  lVar23 = (long)iVar17;
  pIdxInfo = (sqlite3_index_info *)
             sqlite3DbMallocZero(pParse->db,local_b0 * 0x1c + lVar23 * 8 + 0x88);
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    sqlite3ErrorMsg(pParse,"out of memory");
  }
  else {
    psVar4 = (sqlite3_index_orderby *)((long)&pIdxInfo[1].aConstraintUsage + local_b0 * 0x14);
    pIdxInfo->aConstraint = (sqlite3_index_constraint *)(&pIdxInfo[1].aConstraintUsage + local_b0);
    pIdxInfo->aOrderBy = psVar4;
    pIdxInfo->aConstraintUsage = (sqlite3_index_constraint_usage *)(psVar4 + lVar23);
    *(WhereClause **)(pIdxInfo + 1) = local_38;
    pIdxInfo[1].aConstraint = (sqlite3_index_constraint *)pParse;
    pIdxInfo[1].nOrderBy = uVar18;
    *(undefined4 *)&pIdxInfo[1].field_0x14 = 0;
    iVar9 = local_38->nTerm;
    iVar28 = 0;
    if (iVar9 < 1) {
      mNoOmit = 0;
      iVar20 = 0;
    }
    else {
      paVar27 = &local_38->a->u;
      uVar18 = 0;
      iVar30 = 0;
      iVar20 = 0;
      uVar37 = 0;
      do {
        uVar7 = *(u16 *)((long)paVar27 + -0xe);
        if ((uVar7 & 0x40) != 0) {
          psVar3 = (sqlite3_index_constraint *)(&pIdxInfo[1].aConstraintUsage + local_b0) + iVar20;
          psVar3->iColumn = (paVar27->x).leftColumn;
          psVar3->iTermOffset = iVar30;
          uVar8 = *(u16 *)((long)paVar27 + -0xc);
          uVar31 = uVar8 & 0x3fff;
          if (uVar31 == 1) {
            if (-1 < (short)uVar7) {
              uVar32 = 1 << ((byte)iVar20 & 0x1f);
              if (0x1f < iVar20) {
                uVar32 = 0;
              }
              uVar18 = uVar18 | uVar32;
              *(uint *)&pIdxInfo[1].field_0x14 = uVar18;
            }
            psVar3->op = '\x02';
          }
          else if (uVar31 == 0x40) {
            psVar3->op = *(u8 *)((long)paVar27 + -9);
          }
          else if ((uVar8 & 0x180) == 0) {
            psVar3->op = (uchar)uVar8;
            if ((uVar8 & 0x3c) != 0) {
              pEVar24 = ((WhereTerm *)(paVar27 + -4))->pExpr->pRight;
              uVar26 = pEVar24->op;
              if (uVar26 == 0xb0) {
                uVar26 = pEVar24->op2;
              }
              if (uVar26 != 0xb1) {
                if (uVar26 != 0x8a) goto LAB_0018c889;
                pEVar24 = (Expr *)(pEVar24->x).pList;
              }
              if (1 < ((pEVar24->x).pList)->nExpr) {
                uVar32 = 1 << ((byte)iVar20 & 0x1f);
                if (0xf < iVar20) {
                  uVar32 = 0;
                }
                uVar37 = uVar37 | uVar32;
                if (uVar31 == 4) {
                  psVar3->op = ' ';
                }
                else if (uVar31 == 0x10) {
                  psVar3->op = '\b';
                }
              }
            }
          }
          else if (uVar31 == 0x100) {
            psVar3->op = 'G';
          }
          else {
            psVar3->op = 'H';
          }
LAB_0018c889:
          iVar20 = iVar20 + 1;
        }
        mNoOmit = (u16)uVar37;
        iVar30 = iVar30 + 1;
        paVar27 = paVar27 + 7;
      } while (iVar9 != iVar30);
    }
    pIdxInfo->nConstraint = iVar20;
    if (0 < iVar17) {
      lVar25 = 0;
      iVar28 = 0;
      do {
        pEVar24 = *(Expr **)((long)&pEVar12->a[0].pExpr + lVar25);
        local_44 = 1;
        _bIn = (Parse *)0x0;
        local_60 = exprNodeIsConstant;
        local_58 = sqlite3SelectWalkFail;
        if ((pEVar24 != (Expr *)0x0) && (sqlite3WalkExprNN((Walker *)&bIn,pEVar24), local_44 == 0))
        {
          psVar4[iVar28].iColumn = (int)pEVar24->iColumn;
          *(byte *)((long)&pIdxInfo[1].aConstraintUsage + (long)iVar28 * 8 + local_b0 * 0x14 + 4) =
               (&pEVar12->a[0].fg.sortFlags)[lVar25] & 1;
          iVar28 = iVar28 + 1;
        }
        lVar25 = lVar25 + 0x18;
      } while (lVar23 * 0x18 != lVar25);
    }
    pIdxInfo->nOrderBy = iVar28;
    p->rSetup = 0;
    p->wsFlags = 0x400;
    p->nLTerm = 0;
    pbVar2 = (byte *)((long)&p->u + 4);
    *pbVar2 = *pbVar2 & 0xfe;
    uVar18 = pIdxInfo->nConstraint;
    iVar17 = whereLoopResize(pParse->db,p,uVar18);
    if (iVar17 == 0) {
      iVar17 = whereLoopAddVirtualOne
                         (pBuilder,mPrereq,0xffffffffffffffff,0,pIdxInfo,mNoOmit,&bIn,&bRetry);
      if (bRetry != 0) {
        iVar17 = whereLoopAddVirtualOne
                           (pBuilder,mPrereq,0xffffffffffffffff,0,pIdxInfo,mNoOmit,&bIn,(int *)0x0);
      }
      if (iVar17 == 0) {
        uVar38 = ~mPrereq;
        uVar33 = p->prereq & uVar38;
        iVar17 = 0;
        if (bIn != 0 || uVar33 != 0) {
          if (bIn == 0) {
            local_b0 = 0;
            bVar39 = false;
          }
          else {
            iVar17 = whereLoopAddVirtualOne
                               (pBuilder,mPrereq,0xffffffffffffffff,1,pIdxInfo,mNoOmit,&bIn,
                                (int *)0x0);
            local_b0 = p->prereq & uVar38;
            bVar39 = local_b0 == 0;
            if (iVar17 != 0) goto LAB_0018cc47;
          }
          uVar34 = 0;
          bVar16 = bVar39;
          do {
            if ((int)uVar18 < 1) {
LAB_0018cbd0:
              iVar17 = 0;
              if (!bVar39) {
                iVar17 = whereLoopAddVirtualOne
                                   (pBuilder,mPrereq,mPrereq,0,pIdxInfo,mNoOmit,&bIn,(int *)0x0);
                if (bIn == 0) {
                  bVar16 = true;
                }
              }
              if (!bVar16 && iVar17 == 0) {
                iVar17 = whereLoopAddVirtualOne
                                   (pBuilder,mPrereq,mPrereq,1,pIdxInfo,mNoOmit,&bIn,(int *)0x0);
              }
              break;
            }
            lVar23 = 0;
            uVar35 = 0xffffffffffffffff;
            do {
              uVar29 = local_38->a[*(int *)((long)&pIdxInfo->aConstraint->iTermOffset + lVar23)].
                       prereqRight & uVar38;
              uVar36 = uVar35;
              if (uVar29 < uVar35) {
                uVar36 = uVar29;
              }
              if (uVar29 <= uVar34) {
                uVar36 = uVar35;
              }
              lVar23 = lVar23 + 0xc;
              uVar35 = uVar36;
            } while ((ulong)uVar18 * 0xc != lVar23);
            if (uVar36 == 0xffffffffffffffff) goto LAB_0018cbd0;
            iVar17 = 0;
            if (((uVar36 != uVar33) && (uVar36 != local_b0)) &&
               (iVar17 = whereLoopAddVirtualOne
                                   (pBuilder,mPrereq,uVar36 | mPrereq,0,pIdxInfo,mNoOmit,&bIn,
                                    (int *)0x0), p->prereq == mPrereq)) {
              bVar39 = true;
              if (bIn == 0) {
                bVar16 = true;
              }
            }
            uVar34 = uVar36;
          } while (iVar17 == 0);
        }
      }
LAB_0018cc47:
      if (pIdxInfo->needToFreeIdxStr != 0) {
        sqlite3_free(pIdxInfo->idxStr);
      }
      freeIndexInfo(pParse->db,pIdxInfo);
      return iVar17;
    }
    freeIndexInfo(pParse->db,pIdxInfo);
  }
  return 7;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  SrcItem *pSrc;               /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;
  int bRetry = 0;              /* True to retry with LIMIT/OFFSET disabled */

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pWInfo, pWC, mUnusable, pSrc, &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    freeIndexInfo(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x800, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(
      pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, &bRetry
  );
  if( bRetry ){
    assert( rc==SQLITE_OK );
    rc = whereLoopAddVirtualOne(
        pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, 0
    );
  }

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x800, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn, 0);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq)
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x800, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn, 0);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  freeIndexInfo(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}